

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

CameraSample *
pbrt::GetCameraSample<pbrt::SamplerHandle>
          (CameraSample *__return_storage_ptr__,SamplerHandle *sampler,Point2i *pPixel,
          FilterHandle *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  Float FVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  FilterSample FVar11;
  undefined8 local_28;
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  undefined1 extraout_var_00 [56];
  
  auVar7._0_8_ = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
  auVar7._8_56_ = extraout_var;
  local_28 = vmovlps_avx(auVar7._0_16_);
  auVar10 = extraout_var;
  FVar11 = TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
           ::
           Dispatch<pbrt::FilterHandle::Sample(pbrt::Point2<float>const&)const::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::BoxFilter,pbrt::GaussianFilter,pbrt::MitchellFilter,pbrt::LanczosSincFilter,pbrt::TriangleFilter>
                       *)filter,(Point2f *)&local_28);
  auVar8._0_8_ = FVar11.p.super_Tuple2<pbrt::Point2,_float>;
  auVar8._8_56_ = auVar10;
  auVar3 = ZEXT816(0) << 0x40;
  bVar2 = *(byte *)(Options + 0xc);
  if (bVar2 == 0) {
    auVar3 = auVar8._0_16_;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pPixel->super_Tuple2<pbrt::Point2,_int>;
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6._0_4_ = auVar3._0_4_ + auVar5._0_4_;
  auVar6._4_4_ = auVar3._4_4_ + auVar5._4_4_;
  auVar6._8_4_ = auVar3._8_4_ + auVar5._8_4_;
  auVar6._12_4_ = auVar3._12_4_ + auVar5._12_4_;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar3 = vaddps_avx512vl(auVar6,auVar3);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
  (__return_storage_ptr__->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar4 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
          ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                      *)sampler);
  __return_storage_ptr__->time = FVar4;
  auVar9._0_8_ = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
  auVar9._8_56_ = extraout_var_00;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
  (__return_storage_ptr__->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  __return_storage_ptr__->weight =
       (Float)((uint)(bVar2 & 1) * 0x3f800000 + (uint)!(bool)(bVar2 & 1) * (int)FVar11.weight);
  return __return_storage_ptr__;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(Sampler sampler, const Point2i &pPixel,
                                                 FilterHandle filter) {
    FilterSample fs = filter.Sample(sampler.Get2D());
    if (GetOptions().disablePixelJitter) {
        fs.p = Point2f(0, 0);
        fs.weight = 1;
    }

    CameraSample cs;
    cs.pFilm = pPixel + fs.p + Vector2f(0.5, 0.5);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.weight = fs.weight;
    return cs;
}